

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2pnet.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  float fVar1;
  float fVar2;
  char *pcVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  char cVar6;
  int iVar7;
  pair<int,_int> pVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  int i_2;
  undefined8 *puVar11;
  long lVar12;
  int i;
  uint uVar13;
  int iVar14;
  size_type __n;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  bool bVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  vector<float,_std::allocator<float>_> x_;
  vector<int,_std::allocator<int>_> strides;
  Extractor ex;
  vector<float,_std::allocator<float>_> y_;
  float x;
  vector<float,_std::allocator<float>_> all_anchor_points;
  float norm_vals1 [3];
  vector<CrowdPoint,_std::allocator<CrowdPoint>_> crowd_points;
  vector<float,_std::allocator<float>_> shifted_anchor_points;
  vector<float,_std::allocator<float>_> anchor_points;
  float mean_vals1 [3];
  vector<int,_std::allocator<int>_> pyramid_levels;
  Net net;
  Option opt;
  Mat bgr;
  value_type_conflict1 local_400;
  allocator_type local_3f9;
  undefined8 local_3f8;
  float fStack_3f0;
  float fStack_3ec;
  double local_3e8;
  vector<int,_std::allocator<int>_> local_3e0;
  Mat local_3c8;
  undefined1 local_378 [8];
  iterator iStack_370;
  int *local_368;
  undefined1 local_360 [24];
  undefined1 local_348 [56];
  int local_310;
  size_t local_308;
  Mat local_2f8;
  undefined1 local_2a8 [16];
  undefined8 local_298;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined1 local_278 [16];
  pair<int,_int> *local_268;
  undefined1 local_258 [16];
  pointer local_248;
  Mat local_238;
  vector<float,_std::allocator<float>_> local_1e8;
  undefined1 local_1c8 [16];
  pointer local_1b8;
  vector<float,_std::allocator<float>_> local_1b0;
  void *local_198;
  undefined4 local_190;
  double local_180;
  undefined1 local_178 [16];
  pointer local_168;
  Net local_158;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  Option local_d0;
  string local_90 [16];
  uchar *local_80;
  
  if (argc == 2) {
    pcVar3 = argv[1];
    std::__cxx11::string::string((string *)&local_158,pcVar3,(allocator *)&local_238);
    cv::imread(local_90,(int)&local_158);
    if ((Allocator **)local_158._vptr_Net != &local_158.opt.blob_allocator) {
      operator_delete(local_158._vptr_Net);
    }
    cVar6 = cv::Mat::empty();
    if (cVar6 == '\0') {
      local_258 = (undefined1  [16])0x0;
      local_248 = (pointer)0x0;
      ncnn::Option::Option(&local_d0);
      local_d0.num_threads = 4;
      local_d0.use_vulkan_compute = false;
      local_d0.use_bf16_storage = false;
      ncnn::Net::Net(&local_158);
      local_158.opt.num_threads = local_d0.num_threads;
      local_158.opt.lightmode = local_d0.lightmode;
      local_158.opt._1_3_ = local_d0._1_3_;
      local_158.opt.use_vulkan_compute = local_d0.use_vulkan_compute;
      local_158.opt.openmp_blocktime = local_d0.openmp_blocktime;
      local_158.opt.use_winograd_convolution = local_d0.use_winograd_convolution;
      local_158.opt.use_sgemm_convolution = local_d0.use_sgemm_convolution;
      local_158.opt.use_int8_inference = local_d0.use_int8_inference;
      local_158.opt.use_fp16_packed = local_d0.use_fp16_packed;
      local_158.opt.use_fp16_storage = local_d0.use_fp16_storage;
      local_158.opt.use_fp16_arithmetic = local_d0.use_fp16_arithmetic;
      local_158.opt.use_int8_packed = local_d0.use_int8_packed;
      local_158.opt.use_int8_storage = local_d0.use_int8_storage;
      local_158.opt.use_int8_arithmetic = local_d0.use_int8_arithmetic;
      local_158.opt.use_packing_layout = local_d0.use_packing_layout;
      local_158.opt.use_bf16_storage = local_d0.use_bf16_storage;
      local_158.opt.flush_denormals = local_d0.flush_denormals;
      local_158.opt.use_local_pool_allocator = local_d0.use_local_pool_allocator;
      local_158.opt.use_shader_local_memory = local_d0.use_shader_local_memory;
      local_158.opt.use_cooperative_matrix = local_d0.use_cooperative_matrix;
      local_158.opt.use_winograd23_convolution = local_d0.use_winograd23_convolution;
      local_158.opt.use_winograd43_convolution = local_d0.use_winograd43_convolution;
      local_158.opt.use_winograd63_convolution = local_d0.use_winograd63_convolution;
      local_158.opt.use_a53_a55_optimized_kernel = local_d0.use_a53_a55_optimized_kernel;
      local_158.opt.use_reserved_7 = local_d0.use_reserved_7;
      local_158.opt.use_reserved_8 = local_d0.use_reserved_8;
      local_158.opt.use_reserved_9 = local_d0.use_reserved_9;
      local_158.opt.use_reserved_10 = local_d0.use_reserved_10;
      local_158.opt.use_reserved_11 = local_d0.use_reserved_11;
      local_158.opt.use_shader_pack8 = local_d0.use_shader_pack8;
      local_158.opt.use_subgroup_basic = local_d0.use_subgroup_basic;
      local_158.opt.use_subgroup_vote = local_d0.use_subgroup_vote;
      local_158.opt.use_subgroup_ballot = local_d0.use_subgroup_ballot;
      local_158.opt.use_subgroup_shuffle = local_d0.use_subgroup_shuffle;
      local_158.opt.use_image_storage = local_d0.use_image_storage;
      local_158.opt.use_tensor_storage = local_d0.use_tensor_storage;
      local_158.opt.use_reserved_0 = local_d0.use_reserved_0;
      local_158.opt.workspace_allocator = local_d0.workspace_allocator;
      local_158.opt.blob_allocator = local_d0.blob_allocator;
      iVar7 = ncnn::Net::load_param(&local_158,"p2pnet.param");
      if (iVar7 != 0) {
LAB_001624ad:
        exit(-1);
      }
      iVar7 = ncnn::Net::load_model(&local_158,"p2pnet.bin");
      if (iVar7 != 0) goto LAB_001624ad;
      iVar7 = (int)local_90._8_8_;
      iVar14 = SUB84(local_90._8_8_,4);
      local_e8 = CONCAT44(iVar7,iVar14);
      uStack_e0 = 0;
      local_f8 = (iVar14 / 0x80) * 0x80;
      iStack_f4 = (iVar7 / 0x80) * 0x80;
      iStack_f0 = 0;
      iStack_ec = 0;
      ncnn::Mat::from_pixels_resize
                (&local_238,local_80,0x10002,iVar14,iVar7,local_f8,iStack_f4,(Allocator *)0x0);
      local_178 = (undefined1  [16])0x0;
      local_168 = (pointer)0x0;
      local_178._0_8_ = operator_new(4);
      local_168 = (pointer)(local_178._0_8_ + 4);
      *(undefined4 *)local_178._0_8_ = 3;
      local_178._8_8_ = local_168;
      local_2a8 = (undefined1  [16])0x0;
      local_298 = 0;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_3e0,(vector<int,_std::allocator<int>_> *)local_178);
      local_268 = (pair<int,_int> *)0x0;
      local_278 = (undefined1  [16])0x0;
      local_368 = (int *)0x0;
      _local_378 = (undefined1  [16])0x0;
      if (local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        local_3e8 = (double)local_238.h;
        local_180 = (double)local_238.w;
        uVar20 = 0;
        do {
          dVar24 = ldexp(1.0,local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar20]);
          local_3f8._0_4_ = SUB84(dVar24,0);
          local_3f8._4_4_ = (float)((ulong)dVar24 >> 0x20);
          dVar24 = ldexp(1.0,local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar20]);
          dVar24 = floor(((double)CONCAT44(local_3f8._4_4_,(float)local_3f8) + local_3e8 + -1.0) /
                         dVar24);
          local_3f8._0_4_ = SUB84(dVar24,0);
          local_3f8._4_4_ = (float)((ulong)dVar24 >> 0x20);
          local_288 = ldexp(1.0,local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar20]);
          dVar24 = ldexp(1.0,local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar20]);
          iVar7 = (int)(double)CONCAT44(local_3f8._4_4_,(float)local_3f8);
          dVar24 = floor((local_288 + local_180 + -1.0) / dVar24);
          pVar8.first = (int)dVar24;
          pVar8.second = iVar7;
          local_3c8.data._4_4_ = iVar7;
          if ((pair<int,_int> *)local_278._8_8_ == local_268) {
            local_3c8.data._0_4_ = pVar8.first;
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            _M_realloc_insert<std::pair<int,int>>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)local_278,
                       (iterator)local_278._8_8_,(pair<int,_int> *)&local_3c8);
          }
          else {
            *(pair<int,_int> *)local_278._8_8_ = pVar8;
            local_278._8_8_ = (pair<int,_int> *)(local_278._8_8_ + 8);
            local_3c8.data._0_4_ = pVar8.first;
          }
          dVar24 = ldexp(1.0,local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar20]);
          local_3c8.data._0_4_ = (int)dVar24;
          if (iStack_370._M_current == local_368) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)local_378,iStack_370,(int *)&local_3c8);
          }
          else {
            *iStack_370._M_current = (int)local_3c8.data;
            iStack_370._M_current = iStack_370._M_current + 1;
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 < (ulong)((long)local_3e0.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_3e0.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 2));
      }
      if (local_2a8._8_8_ != local_2a8._0_8_) {
        local_2a8._8_8_ = local_2a8._0_8_;
      }
      if (local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        dVar24 = 0.0;
        do {
          local_1c8 = (undefined1  [16])0x0;
          local_1b8 = (pointer)0x0;
          local_3e8 = dVar24;
          dVar24 = ldexp(1.0,local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[(long)dVar24]);
          local_3c8.data._0_4_ = 0;
          local_3c8.data._4_4_ = 0;
          local_3c8.refcount = (int *)0x0;
          local_3c8.elemsize = 0;
          local_348._16_8_ = (float *)0x0;
          local_348._0_8_ = (Allocator *)0x0;
          local_348._8_4_ = 0;
          local_348[0xc] = false;
          local_348[0xd] = false;
          local_348[0xe] = false;
          local_348[0xf] = false;
          local_3f8 = (double)((float)(int)dVar24 * 0.5);
          local_288 = -(double)((int)dVar24 / 2);
          uStack_280 = 0x8000000000000000;
          iVar7 = 1;
          do {
            local_2f8.data._0_4_ = (float)(((double)iVar7 + -0.5) * local_3f8 + local_288);
            if (local_3c8.refcount == (int *)local_3c8.elemsize) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_3c8,
                         (iterator)local_3c8.refcount,(float *)&local_2f8);
            }
            else {
              *local_3c8.refcount = (int)local_2f8.data._0_4_;
              local_3c8.refcount = (int *)((float *)local_3c8.refcount + 1);
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != 3);
          iVar7 = 1;
          do {
            local_2f8.data._0_4_ = (float)(((double)iVar7 + -0.5) * local_3f8 + local_288);
            if (local_348._8_8_ == local_348._16_8_) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)local_348,(iterator)local_348._8_8_,
                         (float *)&local_2f8);
            }
            else {
              *(float *)local_348._8_8_ = local_2f8.data._0_4_;
              local_348._8_8_ = local_348._8_8_ + 4;
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != 3);
          puVar9 = (undefined8 *)operator_new(0x10);
          *puVar9 = 0;
          puVar9[1] = 0;
          puVar10 = (undefined8 *)operator_new(0x10);
          *puVar10 = 0;
          puVar10[1] = 0;
          puVar11 = puVar9;
          lVar12 = 0;
          do {
            lVar16 = 0;
            do {
              *(undefined4 *)((long)puVar11 + lVar16 * 4) =
                   *(undefined4 *)(CONCAT44(local_3c8.data._4_4_,(int)local_3c8.data) + lVar16 * 4);
              lVar16 = lVar16 + 1;
            } while (lVar16 == 1);
            puVar11 = puVar11 + 1;
            bVar23 = lVar12 == 0;
            lVar12 = lVar12 + 1;
          } while (bVar23);
          puVar11 = puVar10;
          lVar12 = 0;
          do {
            lVar16 = 0;
            do {
              *(undefined4 *)((long)puVar11 + lVar16 * 4) =
                   *(undefined4 *)((long)(_func_int ***)local_348._0_8_ + lVar12 * 4);
              lVar16 = lVar16 + 1;
            } while (lVar16 == 1);
            puVar11 = puVar11 + 1;
            bVar23 = lVar12 == 0;
            lVar12 = lVar12 + 1;
          } while (bVar23);
          local_2f8.data._0_4_ = 0.0;
          std::vector<float,_std::allocator<float>_>::resize
                    ((vector<float,_std::allocator<float>_> *)local_1c8,8,
                     (value_type_conflict1 *)&local_2f8);
          lVar12 = 0;
          do {
            fVar1 = *(float *)((long)puVar10 + lVar12 * 4);
            *(float *)(local_1c8._0_8_ + lVar12 * 2 * 4) = *(float *)((long)puVar9 + lVar12 * 4);
            *(float *)(local_1c8._0_8_ + (lVar12 * 2 + 1) * 4) = fVar1;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 4);
          operator_delete(puVar10);
          operator_delete(puVar9);
          if ((Allocator *)local_348._0_8_ != (Allocator *)0x0) {
            operator_delete((void *)local_348._0_8_);
          }
          if ((void *)CONCAT44(local_3c8.data._4_4_,(int)local_3c8.data) != (void *)0x0) {
            operator_delete((void *)CONCAT44(local_3c8.data._4_4_,(int)local_3c8.data));
          }
          local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          uVar21 = *(uint *)(local_278._0_8_ + (long)local_3e8 * 8);
          iVar7 = *(int *)(local_278._0_8_ + 4 + (long)local_3e8 * 8);
          lVar12 = (long)iVar7;
          iVar14 = *(int *)((long)local_378 + (long)local_3e8 * 4);
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_1b0,(vector<float,_std::allocator<float>_> *)local_1c8);
          uVar20 = (ulong)uVar21;
          local_3c8.data._0_4_ = 0;
          local_3c8.data._4_4_ = 0;
          local_3c8.refcount = (int *)0x0;
          local_3c8.elemsize = 0;
          local_348._16_8_ = (float *)0x0;
          local_348._0_8_ = (Allocator *)0x0;
          local_348._8_4_ = 0;
          local_348[0xc] = false;
          local_348[0xd] = false;
          local_348[0xe] = false;
          local_348[0xf] = false;
          local_3f8 = (double)iVar14;
          if (0 < (int)uVar21) {
            uVar13 = 0;
            local_3c8.refcount = (int *)(float *)0x0;
            do {
              local_2f8.data._0_4_ = (float)(((double)(int)uVar13 + 0.5) * local_3f8);
              if (local_3c8.refcount == (int *)local_3c8.elemsize) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)&local_3c8,
                           (iterator)local_3c8.refcount,(float *)&local_2f8);
              }
              else {
                *local_3c8.refcount = (int)local_2f8.data._0_4_;
                local_3c8.refcount = (int *)((float *)local_3c8.refcount + 1);
              }
              uVar13 = uVar13 + 1;
            } while (uVar21 != uVar13);
          }
          if (0 < iVar7) {
            iVar14 = 0;
            do {
              local_2f8.data._0_4_ = (float)(((double)iVar14 + 0.5) * local_3f8);
              if (local_348._8_8_ == local_348._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_348,
                           (iterator)local_348._8_8_,(float *)&local_2f8);
              }
              else {
                *(float *)local_348._8_8_ = local_2f8.data._0_4_;
                local_348._8_8_ = local_348._8_8_ + 4;
              }
              iVar14 = iVar14 + 1;
            } while (iVar7 != iVar14);
          }
          __n = lVar12 * (int)uVar21;
          local_360._0_4_ = 0;
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&local_2f8,__n,
                     (value_type_conflict1 *)local_360,(allocator_type *)&local_198);
          local_198 = (void *)((ulong)local_198 & 0xffffffff00000000);
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)local_360,__n,
                     (value_type_conflict1 *)&local_198,(allocator_type *)&local_400);
          if (0 < iVar7) {
            lVar16 = CONCAT44(local_2f8.data._4_4_,local_2f8.data._0_4_);
            lVar17 = 0;
            do {
              if (0 < (int)uVar21) {
                uVar18 = 0;
                do {
                  *(undefined4 *)(lVar16 + uVar18 * 4) =
                       *(undefined4 *)
                        (CONCAT44(local_3c8.data._4_4_,(int)local_3c8.data) + uVar18 * 4);
                  uVar18 = uVar18 + 1;
                } while (uVar20 != uVar18);
              }
              lVar17 = lVar17 + 1;
              lVar16 = lVar16 + uVar20 * 4;
            } while (lVar17 != lVar12);
            lVar16 = CONCAT44(local_360._4_4_,local_360._0_4_);
            lVar17 = 0;
            do {
              if (0 < (int)uVar21) {
                uVar18 = 0;
                do {
                  *(undefined4 *)(lVar16 + uVar18 * 4) =
                       *(undefined4 *)((long)(_func_int ***)local_348._0_8_ + lVar17 * 4);
                  uVar18 = uVar18 + 1;
                } while (uVar20 != uVar18);
              }
              lVar17 = lVar17 + 1;
              lVar16 = lVar16 + uVar20 * 4;
            } while (lVar17 != lVar12);
          }
          local_400 = 0.0;
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&local_198,__n * 2,&local_400,
                     &local_3f9);
          uVar21 = uVar21 * iVar7;
          if (0 < (int)uVar21) {
            uVar20 = 0;
            do {
              *(undefined4 *)((long)local_198 + uVar20 * 8) =
                   *(undefined4 *)(CONCAT44(local_2f8.data._4_4_,local_2f8.data._0_4_) + uVar20 * 4)
              ;
              *(undefined4 *)((long)local_198 + uVar20 * 8 + 4) =
                   *(undefined4 *)(CONCAT44(local_360._4_4_,local_360._0_4_) + uVar20 * 4);
              uVar20 = uVar20 + 1;
            } while (uVar21 != uVar20);
          }
          local_400 = 0.0;
          std::vector<float,_std::allocator<float>_>::resize
                    (&local_1e8,
                     __n * ((long)local_1b0.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_1b0.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 2) &
                     0x7fffffffffffffff,&local_400);
          if (0 < (int)uVar21) {
            uVar20 = (long)local_1b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_1b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2;
            uVar18 = 0;
            uVar19 = 0;
            do {
              if (1 < uVar20) {
                uVar15 = 0;
                uVar22 = uVar18;
                do {
                  fVar1 = local_1b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar15 * 2 + 1];
                  fVar2 = *(float *)((long)local_198 + (uVar19 * 2 + 1) * 4);
                  local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[(uVar18 & 0xfffffffffffffffe) + uVar15 * 2] =
                       local_1b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar15 * 2] +
                       *(float *)((long)local_198 + uVar19 * 8);
                  *(float *)((long)local_1e8.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + (uVar22 * 4 | 4)) =
                       fVar1 + fVar2;
                  uVar15 = uVar15 + 1;
                  uVar22 = uVar22 + 2;
                } while (uVar20 >> 1 != uVar15);
              }
              uVar19 = uVar19 + 1;
              uVar18 = uVar18 + uVar20;
            } while (uVar19 != uVar21);
          }
          if (local_198 != (void *)0x0) {
            operator_delete(local_198);
          }
          if ((void *)CONCAT44(local_360._4_4_,local_360._0_4_) != (void *)0x0) {
            operator_delete((void *)CONCAT44(local_360._4_4_,local_360._0_4_));
          }
          if ((void *)CONCAT44(local_2f8.data._4_4_,local_2f8.data._0_4_) != (void *)0x0) {
            operator_delete((void *)CONCAT44(local_2f8.data._4_4_,local_2f8.data._0_4_));
          }
          if ((Allocator *)local_348._0_8_ != (Allocator *)0x0) {
            operator_delete((void *)local_348._0_8_);
          }
          if ((void *)CONCAT44(local_3c8.data._4_4_,(int)local_3c8.data) != (void *)0x0) {
            operator_delete((void *)CONCAT44(local_3c8.data._4_4_,(int)local_3c8.data));
          }
          if (local_1b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          std::vector<float,std::allocator<float>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                    ((vector<float,std::allocator<float>> *)local_2a8,local_2a8._8_8_,
                     local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          if (local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_1c8._0_8_);
          }
          dVar24 = (double)((long)local_3e8 + 1);
        } while ((ulong)dVar24 <
                 (ulong)((long)local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start >> 2));
      }
      if ((Point)local_378 != (Point)0x0) {
        operator_delete((void *)local_378);
      }
      if ((void *)local_278._0_8_ != (void *)0x0) {
        operator_delete((void *)local_278._0_8_);
      }
      if (local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_3c8.data._0_4_ = local_2a8._0_4_;
      local_3c8.data._4_4_ = local_2a8._4_4_;
      local_3c8.refcount._0_4_ = 0;
      local_3c8.refcount._4_4_ = 0;
      local_3c8.elemsize = 4;
      local_3c8.elempack = 1;
      local_3c8.allocator = (Allocator *)0x0;
      local_3c8.dims = 2;
      local_3c8.w = 2;
      local_3c8.h = (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 3);
      local_3c8.d = 1;
      local_3c8.c = 1;
      local_3c8.cstep = (long)local_3c8.h * 2;
      ncnn::Net::create_extractor((Net *)local_360);
      local_198 = (void *)0x42e88f5c42f7599a;
      local_190 = 0x42cf0f5c;
      local_278._8_4_ = 0x3c8ec7a9;
      local_278._0_8_ = 0x3c8f5c293c8c4934;
      ncnn::Mat::substract_mean_normalize(&local_238,(float *)&local_198,(float *)local_278);
      ncnn::Extractor::input((Extractor *)local_360,"input",&local_238);
      ncnn::Extractor::input((Extractor *)local_360,"anchor",&local_3c8);
      local_308 = 0;
      local_348._0_8_ = (Allocator *)0x0;
      local_348._8_4_ = 0;
      local_348[0xc] = false;
      local_348[0xd] = false;
      local_348[0xe] = false;
      local_348[0xf] = false;
      local_348._16_8_ = 0;
      local_348._24_4_ = 0;
      local_348._32_8_ = (Allocator *)0x0;
      local_348._40_4_ = 0;
      local_348._44_4_ = 0;
      local_348._48_8_ = (NetPrivate *)0x0;
      local_310 = 0;
      local_2f8.cstep = 0;
      local_2f8.data._0_4_ = 0.0;
      local_2f8.data._4_4_ = 0;
      local_2f8.refcount._0_4_ = 0;
      local_2f8.refcount._4_4_ = 0;
      local_2f8.elemsize = 0;
      local_2f8.elempack = 0;
      local_2f8.allocator = (Allocator *)0x0;
      local_2f8.dims = 0;
      local_2f8.w = 0;
      local_2f8.h = 0;
      local_2f8.d = 0;
      local_2f8.c = 0;
      ncnn::Extractor::extract((Extractor *)local_360,"pred_scores",(Mat *)local_348,0);
      ncnn::Extractor::extract((Extractor *)local_360,"pred_points",&local_2f8,0);
      if (0 < local_2f8.h) {
        local_3f8._0_4_ = (float)local_f8;
        local_3f8._4_4_ = (float)iStack_f4;
        fStack_3f0 = (float)iStack_f0;
        fStack_3ec = (float)iStack_ec;
        local_288 = (double)CONCAT44((float)local_e8._4_4_,(float)(int)local_e8);
        uStack_280 = CONCAT44((float)uStack_e0._4_4_,(float)(int)uStack_e0);
        lVar12 = 0;
        do {
          auVar5 = _local_378;
          auVar25._8_8_ = 0;
          auVar25._0_8_ =
               *(ulong *)(CONCAT44(local_2f8.data._4_4_,local_2f8.data._0_4_) +
                         local_2f8.w * lVar12 * local_2f8.elemsize);
          auVar26._4_4_ = local_3f8._4_4_;
          auVar26._0_4_ = (float)local_3f8;
          auVar26._8_4_ = fStack_3f0;
          auVar26._12_4_ = fStack_3ec;
          auVar26 = divps(auVar25,auVar26);
          local_378._4_4_ = (int)(auVar26._4_4_ * local_288._4_4_);
          local_378._0_4_ = (int)(auVar26._0_4_ * (float)local_288);
          iStack_370._M_current._4_4_ = auVar5._12_4_;
          iStack_370._M_current._0_4_ =
               *(float *)((long)(_func_int ***)local_348._0_8_ +
                         (int)local_348._44_4_ * lVar12 * local_348._16_8_ + 4);
          std::vector<CrowdPoint,_std::allocator<CrowdPoint>_>::push_back
                    ((vector<CrowdPoint,_std::allocator<CrowdPoint>_> *)local_258,
                     (value_type *)local_378);
          lVar12 = lVar12 + 1;
        } while (lVar12 < local_2f8.h);
      }
      piVar4 = (int *)CONCAT44(local_2f8.refcount._4_4_,local_2f8.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_2f8.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_2f8.data._4_4_,local_2f8.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_2f8.data._4_4_,local_2f8.data._0_4_));
            }
          }
          else {
            (*(local_2f8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_2f8.cstep = 0;
      local_2f8.data._0_4_ = 0.0;
      local_2f8.data._4_4_ = 0;
      local_2f8.refcount._0_4_ = 0;
      local_2f8.refcount._4_4_ = 0;
      local_2f8.elemsize = 0;
      local_2f8.elempack = 0;
      local_2f8.dims = 0;
      local_2f8.w = 0;
      local_2f8.h = 0;
      local_2f8.d = 0;
      local_2f8.c = 0;
      piVar4 = (int *)CONCAT44(local_348._12_4_,local_348._8_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if ((Allocator *)local_348._32_8_ == (Allocator *)0x0) {
            if ((Allocator *)local_348._0_8_ != (Allocator *)0x0) {
              free((void *)local_348._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_348._32_8_)[3])();
          }
        }
      }
      local_308 = 0;
      local_348._0_8_ = (Allocator *)0x0;
      local_348._8_4_ = 0;
      local_348[0xc] = false;
      local_348[0xd] = false;
      local_348[0xe] = false;
      local_348[0xf] = false;
      local_348._16_8_ = (float *)0x0;
      local_348._24_4_ = 0;
      local_348._40_4_ = 0;
      local_348._44_4_ = 0;
      local_348._48_8_ = (NetPrivate *)0x0;
      local_310 = 0;
      ncnn::Extractor::~Extractor((Extractor *)local_360);
      piVar4 = (int *)CONCAT44(local_3c8.refcount._4_4_,local_3c8.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_3c8.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_3c8.data._4_4_,(int)local_3c8.data) != (void *)0x0) {
              free((void *)CONCAT44(local_3c8.data._4_4_,(int)local_3c8.data));
            }
          }
          else {
            (*(local_3c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_3c8.cstep = 0;
      local_3c8.data._0_4_ = 0;
      local_3c8.data._4_4_ = 0;
      local_3c8.refcount._0_4_ = 0;
      local_3c8.refcount._4_4_ = 0;
      local_3c8.elemsize = 0;
      local_3c8.elempack = 0;
      local_3c8.dims = 0;
      local_3c8.w = 0;
      local_3c8.h = 0;
      local_3c8.d = 0;
      local_3c8.c = 0;
      if ((void *)local_2a8._0_8_ != (void *)0x0) {
        operator_delete((void *)local_2a8._0_8_);
      }
      if ((pointer)local_178._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_178._0_8_);
      }
      if (local_238.refcount != (int *)0x0) {
        LOCK();
        *local_238.refcount = *local_238.refcount + -1;
        UNLOCK();
        if (*local_238.refcount == 0) {
          if (local_238.allocator == (Allocator *)0x0) {
            if ((size_t *)local_238.data != (size_t *)0x0) {
              free(local_238.data);
            }
          }
          else {
            (*(local_238.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&local_158);
      cv::Mat::clone();
      if (local_258._8_8_ != local_258._0_8_) {
        lVar12 = 8;
        uVar20 = 0;
        do {
          if (0.5 < *(float *)((long)&(((pointer)local_258._0_8_)->pt).x + lVar12)) {
            local_3c8.elemsize = 0;
            local_3c8.data._0_4_ = 0x3010000;
            local_3c8.refcount = (int *)&local_158;
            local_348._0_8_ = *(undefined8 *)(local_258._0_8_ + lVar12 + -8);
            local_238.data = (void *)0x0;
            local_238.refcount = (int *)0x0;
            local_238.elemsize = 0x406fe00000000000;
            local_238.elempack = 0;
            local_238._28_4_ = 0;
            cv::circle(&local_3c8,local_348,4,&local_238,0xffffffff,8,0);
          }
          uVar20 = uVar20 + 1;
          uVar18 = ((long)(local_258._8_8_ - local_258._0_8_) >> 2) * -0x5555555555555555;
          lVar12 = lVar12 + 0xc;
        } while (uVar20 <= uVar18 && uVar18 - uVar20 != 0);
      }
      local_238.elemsize = CONCAT26(local_238.elemsize._6_2_,0x6567616d69);
      local_238.refcount = (int *)0x5;
      local_3c8.elemsize = 0;
      local_3c8.data._0_4_ = 0x1010000;
      local_3c8.refcount = (int *)&local_158;
      local_238.data = &local_238.elemsize;
      cv::imshow((string *)&local_238,(_InputArray *)&local_3c8);
      if ((size_t *)local_238.data != &local_238.elemsize) {
        operator_delete(local_238.data);
      }
      cv::waitKey(0);
      cv::Mat::~Mat((Mat *)&local_158);
      if ((pointer)local_258._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_258._0_8_);
      }
      iVar7 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar3);
      iVar7 = -1;
    }
    cv::Mat::~Mat((Mat *)local_90);
  }
  else {
    main_cold_1();
    iVar7 = -1;
  }
  return iVar7;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat bgr = cv::imread(imagepath, 1);
    if (bgr.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<CrowdPoint> crowd_points;
    detect_crowd(bgr, crowd_points);
    draw_result(bgr, crowd_points);

    return 0;
}